

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  reference in;
  int *elem;
  const_iterator __end0;
  const_iterator __begin0;
  forward_list<int,_std::allocator<int>_> *__range3;
  OutputStream *in_stack_ffffffffffffffb8;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  local_30._M_node =
       (_Fwd_list_node_base *)
       std::forward_list<int,_std::allocator<int>_>::begin
                 ((forward_list<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
  local_38._M_node =
       (_Fwd_list_node_base *)
       std::forward_list<int,_std::allocator<int>_>::end
                 ((forward_list<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    in = std::_Fwd_list_const_iterator<int>::operator*((_Fwd_list_const_iterator<int> *)0x17bb39);
    serialize<int,OutputStream>(in,in_stack_ffffffffffffffb8);
    std::_Fwd_list_const_iterator<int>::operator++(&local_30);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }